

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O1

void __thiscall QByteArray::resize(QByteArray *this,qsizetype size)

{
  Data *pDVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = 0;
  if (size < 1) {
    size = lVar3;
  }
  pDVar1 = (this->d).d;
  if (pDVar1 != (Data *)0x0) {
    lVar3 = (pDVar1->super_QArrayData).alloc;
  }
  lVar4 = ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) -
          (long)(this->d).ptr;
  if (pDVar1 == (Data *)0x0) {
    bVar2 = true;
    lVar4 = 0;
  }
  else {
    bVar2 = 1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
  }
  if ((bVar2) || (lVar4 + lVar3 < size)) {
    reallocData(this,size,Grow);
  }
  (this->d).size = size;
  pDVar1 = (this->d).d;
  if ((pDVar1 != (Data *)0x0) && ((pDVar1->super_QArrayData).alloc != 0)) {
    (this->d).ptr[size] = '\0';
  }
  return;
}

Assistant:

void QByteArray::resize(qsizetype size)
{
    if (size < 0)
        size = 0;

    const auto capacityAtEnd = capacity() - d.freeSpaceAtBegin();
    if (d->needsDetach() || size > capacityAtEnd)
        reallocData(size, QArrayData::Grow);
    d.size = size;
    if (d->allocatedCapacity())
        d.data()[size] = 0;
}